

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

void __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ComputeShaderBase(ComputeShaderBase *this)

{
  int iVar1;
  PixelFormat *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined1 auVar4 [16];
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<float,_4> local_30;
  
  deqp::SubcaseBase::SubcaseBase(&this->super_SubcaseBase);
  (this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubcaseBase_01dc36e8;
  iVar3 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  this->renderTarget = (RenderTarget *)CONCAT44(extraout_var,iVar3);
  this->pixelFormat = &((RenderTarget *)CONCAT44(extraout_var,iVar3))->m_pixelFormat;
  tcu::Vector<float,_4>::Vector(&this->g_color_eps);
  pPVar2 = this->pixelFormat;
  iVar3 = pPVar2->redBits;
  if ((iVar3 != 0) && (iVar1 = pPVar2->greenBits, iVar1 != 0)) {
    if ((pPVar2->blueBits != 0) && (pPVar2->alphaBits != 0)) {
      auVar4._0_4_ = (float)(int)(float)(iVar3 * 0x800000 + 0x3f800000) + -1.0;
      auVar4._4_4_ = (float)(int)(float)(iVar1 * 0x800000 + 0x3f800000) + -1.0;
      auVar4._8_4_ = (float)(int)(float)(pPVar2->blueBits * 0x800000 + 0x3f800000) + -1.0;
      auVar4._12_4_ = (float)(int)(float)(pPVar2->alphaBits * 0x800000 + 0x3f800000) + -1.0;
      local_48.m_data = (float  [4])divps(_DAT_0166f110,auVar4);
      tcu::Vector<float,_4>::Vector(&local_30,0.00012207031);
      tcu::operator+((tcu *)&local_58,&local_48,&local_30);
      goto LAB_009c2ff1;
    }
    if (pPVar2->blueBits != 0) {
      local_48.m_data[1] = 1.0 / ((float)(1 << ((byte)iVar1 & 0x1f)) + -1.0);
      local_48.m_data[0] = 1.0 / ((float)(1 << ((byte)iVar3 & 0x1f)) + -1.0);
      local_48.m_data[2] = 1.0 / ((float)(1 << ((byte)pPVar2->blueBits & 0x1f)) + -1.0);
      local_48.m_data[3] = 1.0;
      tcu::Vector<float,_4>::Vector(&local_30,0.00012207031);
      tcu::operator+((tcu *)&local_58,&local_48,&local_30);
      goto LAB_009c2ff1;
    }
  }
  tcu::Vector<float,_4>::Vector(&local_58,0.00012207031);
LAB_009c2ff1:
  *(undefined8 *)(this->g_color_eps).m_data = local_58.m_data._0_8_;
  *(undefined8 *)((this->g_color_eps).m_data + 2) = local_58.m_data._8_8_;
  return;
}

Assistant:

ComputeShaderBase()
		: renderTarget(m_context.getRenderContext().getRenderTarget()), pixelFormat(renderTarget.getPixelFormat())
	{
		float epsilon_zero = 1.f / (1 << 13);
		if (pixelFormat.redBits != 0 && pixelFormat.greenBits != 0 && pixelFormat.blueBits != 0 &&
			pixelFormat.alphaBits != 0)
		{
			g_color_eps = vec4(1.f / ((float)(1 << pixelFormat.redBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.greenBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.blueBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.alphaBits) - 1.0f)) +
						  vec4(epsilon_zero);
		}
		else if (pixelFormat.redBits != 0 && pixelFormat.greenBits != 0 && pixelFormat.blueBits != 0)
		{
			g_color_eps = vec4(1.f / ((float)(1 << pixelFormat.redBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.greenBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.blueBits) - 1.0f), 1.f) +
						  vec4(epsilon_zero);
		}
		else
		{
			g_color_eps = vec4(epsilon_zero);
		}
	}